

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O3

Amap_Obj_t * Amap_ManCreatePo(Amap_Man_t *p,Amap_Obj_t *pFan0)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Amap_Obj_t *pAVar4;
  void **ppvVar5;
  uint *puVar6;
  uint uVar7;
  
  pAVar4 = Amap_ManSetupObj(p);
  *(ulong *)pAVar4 =
       *(ulong *)pAVar4 & 0xe0000000ffffffff | (ulong)(p->vPos->nSize & 0x1fffffff) << 0x20;
  pVVar3 = p->vPos;
  uVar1 = pVVar3->nSize;
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar5 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar5[iVar2] = pAVar4;
  *(ulong *)pAVar4 = *(ulong *)pAVar4 & 0xfffffffffffffff8 | 3;
  puVar6 = (uint *)((ulong)pFan0 & 0xfffffffffffffffe);
  pAVar4->Fan[0] = ((uint)pFan0 & 1) + (*puVar6 >> 3) * 2;
  puVar6[4] = puVar6[4] + 1;
  uVar1 = puVar6[2];
  pAVar4->Level = uVar1;
  uVar7 = p->nLevelMax;
  if (p->nLevelMax < (int)uVar1) {
    p->nLevelMax = uVar1;
    uVar7 = uVar1;
  }
  if ((int)uVar7 < 0xffe) {
    p->nObjs[3] = p->nObjs[3] + 1;
    return pAVar4;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0x79,"Amap_Obj_t *Amap_ManCreatePo(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreatePo( Amap_Man_t * p, Amap_Obj_t * pFan0 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->IdPio  = Vec_PtrSize( p->vPos );
    Vec_PtrPush( p->vPos, pObj );
    pObj->Type   = AMAP_OBJ_PO;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Level  = Amap_Regular(pFan0)->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_PO]++;
    return pObj;
}